

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTensors.h
# Opt level: O2

void __thiscall
chrono::ChVoightTensor<double>::Rotate(ChVoightTensor<double> *this,ChMatrix33<double> *Rot)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  Product<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_0>
  local_70;
  undefined1 local_58 [16];
  double dStack_48;
  double dStack_38;
  undefined1 local_30 [16];
  double local_20;
  double local_18;
  
  local_58._0_8_ =
       (this->super_ChVectorN<double,_6>).
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0];
  local_70.m_lhs.m_rhs = (RhsNested)local_58;
  local_18 = (this->super_ChVectorN<double,_6>).
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2];
  dVar1 = (this->super_ChVectorN<double,_6>).
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1];
  auVar4._8_8_ = dVar1;
  auVar4._0_8_ = dVar1;
  auVar4._16_8_ = dVar1;
  auVar4._24_8_ = dVar1;
  auVar2 = *(undefined1 (*) [16])
            ((this->super_ChVectorN<double,_6>).
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array + 4
            );
  local_20 = (this->super_ChVectorN<double,_6>).
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5];
  auVar3 = vunpcklpd_avx(*(undefined1 (*) [16])
                          ((this->super_ChVectorN<double,_6>).
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                           m_data.array + 3),auVar2);
  auVar4 = vblendpd_avx(ZEXT1632(auVar3),auVar4,8);
  unique0x0011ef00 = vpermpd_avx2(auVar4,0xc4);
  local_30 = vshufpd_avx(auVar2,auVar2,1);
  local_70.m_lhs.m_lhs = &Rot->super_Matrix<double,_3,_3,_1,_3,_3>;
  local_70.m_rhs.m_matrix = &Rot->super_Matrix<double,_3,_3,_1,_3,_3>;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>,Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>,0>>
            (local_70.m_lhs.m_rhs,&local_70);
  (this->super_ChVectorN<double,_6>).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
  m_storage.m_data.array[0] = (double)local_58._0_8_;
  (this->super_ChVectorN<double,_6>).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
  m_storage.m_data.array[1] = dStack_38;
  (this->super_ChVectorN<double,_6>).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
  m_storage.m_data.array[2] = local_18;
  (this->super_ChVectorN<double,_6>).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
  m_storage.m_data.array[3] = (double)local_58._8_8_;
  (this->super_ChVectorN<double,_6>).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
  m_storage.m_data.array[4] = dStack_48;
  (this->super_ChVectorN<double,_6>).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
  m_storage.m_data.array[5] = (double)local_30._0_8_;
  return;
}

Assistant:

void Rotate(ChMatrix33<Real> Rot) {
        ChMatrix33<Real> T;
        // do  T'= R*T*R'
        ConvertToMatrix(T);
        T = Rot * T * Rot.transpose();
        ConvertFromMatrix(T);  // to do, more efficient: unroll matrix multiplications and exploit T symmetry
    }